

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O3

int cal_sigidx(ex_ex *optr,int i,t_float rem_i,int idx,int vsize,t_float *curvec,t_float *prevec)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  
  uVar3 = i + idx;
  if (uVar3 == 0 || SCARRY4(i,idx) != (int)uVar3 < 0) {
    if (uVar3 == 0) {
      iVar1 = 0;
      fVar5 = *curvec;
      if ((rem_i == 0.0) && (!NAN(rem_i))) goto LAB_0019be86;
      uVar2 = (ulong)vsize;
    }
    else {
      uVar4 = uVar3 + vsize;
      if (uVar4 == 0 || SCARRY4(uVar3,vsize) != (int)uVar4 < 0) {
        fVar5 = *prevec;
        iVar1 = 1;
        goto LAB_0019be86;
      }
      iVar1 = 0;
      uVar2 = (ulong)uVar4;
      fVar5 = prevec[uVar2];
      if ((rem_i == 0.0) && (!NAN(rem_i))) goto LAB_0019be86;
    }
    fVar6 = fVar5 - prevec[uVar2 - 1];
  }
  else {
    iVar1 = 0;
    fVar5 = curvec[uVar3];
    if ((rem_i == 0.0) && (!NAN(rem_i))) goto LAB_0019be86;
    fVar6 = fVar5 - curvec[(ulong)uVar3 - 1];
  }
  iVar1 = 0;
  fVar5 = fVar5 + rem_i * fVar6;
LAB_0019be86:
  (optr->ex_cont).v_flt = fVar5;
  return iVar1;
}

Assistant:

static int
cal_sigidx(struct ex_ex *optr,  /* The output value */
           int i, t_float rem_i,/* integer and fractinal part of index */
           int idx,             /* index of current fexpr~ processing */
           int vsize,           /* vector size */
           t_float *curvec, t_float *prevec)        /* current and previous table */
{
        int n;

        n = i + idx;
        if (n > 0) {
                /* from the curvec */
                if (rem_i)
                        optr->ex_flt = curvec[n] +
                                        rem_i * (curvec[n] - curvec[n - 1]);
                else
                        optr->ex_flt = curvec[n];
                return (0);
        }
        if (n == 0) {
                /*
                 * this is the case that the remaining float
                 * is between two tables
                 */
                if (rem_i)
                        optr->ex_flt = *curvec +
                                        rem_i * (*curvec - prevec[vsize - 1]);
                else
                        optr->ex_flt = *curvec;
                return (0);
        }
        /* find the index in the saved buffer */
        n = vsize + n;
        if (n > 0) {
                if (rem_i)
                        optr->ex_flt = prevec[n] +
                                        rem_i * (prevec[n] - prevec[n - 1]);
                else
                        optr->ex_flt = prevec[n];
                return (0);
        }
        /* out of bound */
        optr->ex_flt = *prevec;
        return (1);
}